

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic_orix.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  _func_void_float_ptr_float_6000__ptr_float_ptr *f;
  float **args;
  type __d;
  ostream *poVar2;
  char *pcVar3;
  rep rVar4;
  rep rVar5;
  bool test_ok;
  double parallel_time;
  double serial_time;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t0;
  int j;
  int i;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff88;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffff90;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffa8;
  _func_void_float_ptr *in_stack_ffffffffffffffb0;
  int local_18;
  int local_14;
  
  printf("Using %d chunks\n",4);
  for (local_14 = 0; local_14 < 6000; local_14 = local_14 + 1) {
    v[local_14] = (float)local_14;
  }
  for (local_14 = 0; local_14 < 6000; local_14 = local_14 + 1) {
    result[local_14] = 0.0;
    for (local_18 = 0; local_18 < 6000; local_18 = local_18 + 1) {
      mx[local_14][local_18] = (float)(local_14 + local_18);
    }
  }
  f = (_func_void_float_ptr_float_6000__ptr_float_ptr *)std::chrono::_V2::system_clock::now();
  mxv(result,mx,v);
  args = (float **)std::chrono::_V2::system_clock::now();
  for (local_14 = 0; local_14 < 6000; local_14 = local_14 + 0x5dc) {
    depspawn::
    spawn<void_(float_*,_const_float_(*)[6000],_const_float_*),_float_*,_const_float_(*)[6000],_float_(&)[6000]>
              (f,args,(float (**) [6000])(result + local_14),(float (*) [6000])(mx + local_14));
    depspawn::spawn<void(float*),float*>
              (in_stack_ffffffffffffffb0,(float **)in_stack_ffffffffffffffa8.__r);
  }
  depspawn::wait_for_all();
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            (in_stack_ffffffffffffff88,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff90.__r,
             &in_stack_ffffffffffffff88->__d);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffa8);
  __d = std::chrono::operator-
                  (in_stack_ffffffffffffff88,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff90.__r,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)__d.__r);
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffff90);
  poVar2 = std::operator<<((ostream *)&std::cout,"Serial time: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar4);
  poVar2 = std::operator<<(poVar2,"s.  Parallel time: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar5);
  std::operator<<(poVar2,"s.\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Speedup (using ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
  poVar2 = std::operator<<(poVar2," chunks): ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar4 / rVar5);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = test();
  poVar2 = std::operator<<((ostream *)&std::cout,"TEST ");
  pcVar3 = "UNSUCCESSFUL";
  if ((bVar1 & 1) != 0) {
    pcVar3 = "SUCCESSFUL";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return (int)((bVar1 ^ 0xff) & 1);
}

Assistant:

int main(int argc, char **argv)
{ int i, j;
  
  assert(!(M % CHUNKS));
  
  printf("Using %d chunks\n", CHUNKS);

  for (i = 0; i < N; i++) {
    v[i] = i;
  }
  
  for (i = 0; i < M; i++) {
    result[i] = 0;
    for( j = 0; j < N; j++)
      mx[i][j] = i + j;
  }
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t0 = std::chrono::high_resolution_clock::now();
  
  mxv(result, mx, v);
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t1 = std::chrono::high_resolution_clock::now();
  
  //matrix - vector product using CHUNKS chunks
  for(i = 0; i < M; i+= BCK) {
    //mxv(result + i, (const Type (*)[N]) &(mx[i][0]), v);
    spawn(mxv, result + i, (const Type (*)[N]) &(mx[i][0]), v);
    //pica(result + i);
    spawn(pica, result + i);
  }
 
  wait_for_all();
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t2 = std::chrono::high_resolution_clock::now();
  
  double serial_time = std::chrono::duration<double>(t1-t0).count();
  double parallel_time = std::chrono::duration<double>(t2-t1).count();
  
  std::cout << "Serial time: " << serial_time << "s.  Parallel time: " << parallel_time << "s.\n";
  std::cout << "Speedup (using " << CHUNKS << " chunks): " <<  (serial_time / parallel_time) << std::endl;
  
  const bool test_ok = test();
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}